

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  cmMakefile *makefile;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmGlobalGenerator *this_00;
  auto_ptr<cmCompiledGeneratorExpression> local_c0;
  auto_ptr<cmCompiledGeneratorExpression> local_b8;
  cmGeneratorExpression local_b0;
  cmCompiledGeneratorExpression *local_a8;
  auto_ptr<cmCompiledGeneratorExpression> local_a0;
  auto_ptr<cmCompiledGeneratorExpression> conditionCge;
  cmGeneratorExpression conditionGe;
  auto_ptr<cmCompiledGeneratorExpression> local_80;
  auto_ptr<cmCompiledGeneratorExpression> outputCge;
  undefined1 local_68 [8];
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  bool inputIsContent_local;
  string *condition_local;
  string *outputExpr_local;
  string *inputName_local;
  cmFileCommand *this_local;
  
  cmMakefile::GetBacktrace((cmListFileBacktrace *)&outputGe,(this->super_cmCommand).Makefile);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_68,(cmListFileBacktrace *)&outputGe);
  cmGeneratorExpression::Parse(&conditionGe,(string *)local_68);
  r = cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&conditionGe);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_80,r);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&conditionGe);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&conditionCge,(cmListFileBacktrace *)&outputGe);
  cmGeneratorExpression::Parse(&local_b0,(string *)&conditionCge);
  local_a8 = (cmCompiledGeneratorExpression *)
             cmsys::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)&local_b0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
            (&local_a0,(auto_ptr_ref<cmCompiledGeneratorExpression>)local_a8);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b0);
  this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_b8,&local_80);
  makefile = (this->super_cmCommand).Makefile;
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_c0,&local_a0);
  cmGlobalGenerator::AddEvaluationFile
            (this_00,inputName,&local_b8,makefile,&local_c0,inputIsContent);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_c0);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_b8);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&conditionCge);
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_80);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_68);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&outputGe);
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string &inputName,
                                      const std::string &outputExpr,
                                      const std::string &condition,
                                      bool inputIsContent
                                     )
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(&lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> outputCge
                                                = outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(&lfbt);
  cmsys::auto_ptr<cmCompiledGeneratorExpression> conditionCge
                                              = conditionGe.Parse(condition);

  this->Makefile->GetGlobalGenerator()->AddEvaluationFile(inputName,
                                                          outputCge,
                                                          this->Makefile,
                                                          conditionCge,
                                                          inputIsContent);
}